

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

ui_event object_skin_process_direction(menu_conflict *m,int dir)

{
  short sVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_EDX;
  undefined4 uVar5;
  ui_event uVar6;
  
  sVar1 = ddx[dir];
  if (sVar1 == 0) {
LAB_001f705c:
    uVar5 = in_EDX;
    uVar2 = uVar5;
    if (ddy[dir] == 0) goto LAB_001f7078;
    m->cursor = m->cursor + (int)ddy[dir];
    uVar3 = 0x20;
  }
  else {
    uVar5 = 0x21b1f0;
    uVar2 = 0x21b1f0;
    if (ddy[dir] == 0) {
      in_EDX = 0x21b1f0;
      if (sVar1 != 0) {
        uVar4 = ((ulong)(-1 < sVar1) << 0x20) + 0x8100000000;
        uVar3 = 0x80;
        goto LAB_001f707c;
      }
      goto LAB_001f705c;
    }
LAB_001f7078:
    uVar5 = uVar2;
    uVar3 = 0;
  }
  uVar4 = 0;
LAB_001f707c:
  uVar6._0_8_ = uVar3 | uVar4;
  uVar6._8_4_ = uVar5;
  return uVar6;
}

Assistant:

static ui_event object_skin_process_direction(struct menu *m, int dir)
{
	ui_event out = EVENT_EMPTY;

	/* Reject diagonals */
	if (ddx[dir] && ddy[dir])
		;

	/* Prepare to switch menus */
	else if (ddx[dir]) {
		out.type = EVT_SWITCH;
		out.key.code = ddx[dir] < 0 ? ARROW_LEFT : ARROW_RIGHT;
	}

	/* Move up or down to the next valid & visible row */
	else if (ddy[dir]) {
		m->cursor += ddy[dir];
		out.type = EVT_MOVE;
	}

	return out;
}